

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O3

int png_image_write_main(png_voidp argument)

{
  long lVar1;
  ushort uVar2;
  uint uVar3;
  png_imagep image_in;
  png_structrp png_ptr;
  png_inforp info_ptr;
  long *plVar4;
  png_byte pVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  size_t size;
  png_voidp ptr;
  uint uVar10;
  ulong uVar11;
  int num_trans;
  long lVar12;
  png_uint_32 pVar13;
  png_byte *ppVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  code *function;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  png_const_bytep row;
  long lVar26;
  bool bVar27;
  bool bVar28;
  void *cmap;
  ulong local_490;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  long local_470;
  png_byte local_438 [256];
  png_color palette [256];
  
  image_in = *argument;
  png_ptr = image_in->opaque->png_ptr;
  uVar3 = image_in->format;
  if ((uVar3 & 0xc) == 4) {
    bVar27 = *(int *)((long)argument + 0x20) == 0;
  }
  else {
    bVar27 = false;
  }
  info_ptr = image_in->opaque->info_ptr;
  png_set_benign_errors(png_ptr,0);
  pVar13 = image_in->width;
  uVar15 = 1;
  if ((image_in->format & 8) == 0) {
    uVar15 = (image_in->format & 3) + 1;
  }
  if ((uint)(0x7fffffff / (ulong)uVar15) < pVar13) {
    png_error(image_in->opaque->png_ptr,"image row stride too large");
  }
  uVar15 = uVar15 * pVar13;
  uVar7 = *(uint *)((long)argument + 0x10);
  if (*(uint *)((long)argument + 0x10) == 0) {
    *(uint *)((long)argument + 0x10) = uVar15;
    uVar7 = uVar15;
  }
  uVar10 = -uVar7;
  if (0 < (int)uVar7) {
    uVar10 = uVar7;
  }
  if (uVar10 < uVar15) {
    png_error(image_in->opaque->png_ptr,"supplied row stride too small");
  }
  uVar7 = image_in->height;
  if ((int)((ulong)uVar15 * (ulong)uVar7 >> 0x20) != 0) {
    png_error(image_in->opaque->png_ptr,"memory image too large");
  }
  if ((uVar3 & 8) == 0) {
    png_set_IHDR(png_ptr,info_ptr,pVar13,uVar7,(uint)bVar27 * 8 + 8,
                 (uint)((byte)(((byte)uVar3 & 2) << 5 | (byte)uVar3 << 7) >> 5),0,0,0);
  }
  else {
    if ((*(long *)((long)argument + 0x18) == 0) ||
       (uVar15 = image_in->colormap_entries, uVar15 == 0)) {
      png_error(image_in->opaque->png_ptr,"no color-map for color-mapped image");
    }
    iVar8 = 8;
    if ((uVar15 < 0x11) && (iVar8 = 4, uVar15 < 5)) {
      iVar8 = 2 - (uint)(uVar15 < 3);
    }
    num_trans = 0;
    png_set_IHDR(png_ptr,info_ptr,pVar13,uVar7,iVar8,3,0,0,0);
    plVar4 = *argument;
    lVar9 = *(long *)((long)argument + 0x18);
    uVar15 = *(uint *)((long)plVar4 + 0x14);
    uVar7 = *(uint *)((long)plVar4 + 0x1c);
    uVar10 = 0x100;
    if (uVar7 < 0x100) {
      uVar10 = uVar7;
    }
    memset(local_438,0xff,0x100);
    memset(palette,0,0x300);
    if (uVar7 != 0) {
      uVar16 = uVar15 & 3;
      lVar12 = (ulong)uVar16 + 1;
      uVar20 = uVar15 >> 3 & 2;
      uVar24 = 0;
      bVar28 = (uVar15 & 0x21) == 0x21;
      uVar7 = uVar16;
      if (bVar28) {
        uVar7 = 0;
      }
      uVar22 = (ulong)bVar28;
      uVar6 = uVar20 + bVar28;
      uVar11 = (ulong)uVar6;
      uVar19 = (ulong)(uVar6 ^ 2);
      uVar18 = (ulong)(bVar28 ^ 1);
      local_470 = (ulong)!bVar28 * 3;
      local_478 = (ulong)(uVar15 >> 2 & 4);
      lVar1 = (ulong)(uVar15 & 3) * 2 + 2;
      uVar21 = (ulong)((uVar20 ^ 2) * 2);
      local_480 = (ulong)(uVar6 * 2);
      local_488 = (ulong)((uVar6 ^ 2) * 2);
      local_490 = (ulong)((uint)bVar28 * 2);
      uVar17 = (ulong)(uVar7 * 2);
      lVar26 = uVar22 + 1;
      ppVar14 = &palette[0].blue;
      uVar25 = (ulong)(uint)((int)lVar26 * 2);
      lVar23 = 2;
      num_trans = 0;
      do {
        iVar8 = (int)uVar24;
        if ((uVar15 & 4) == 0) {
          switch(uVar16) {
          case 1:
            pVar5 = *(png_byte *)(lVar9 + uVar18);
            local_438[uVar24] = pVar5;
            if (pVar5 != 0xff) {
              num_trans = iVar8 + 1;
            }
          case 0:
            pVar5 = *(png_byte *)(lVar9 + uVar22);
            ppVar14[-1] = pVar5;
            ((png_color *)(ppVar14 + -2))->red = pVar5;
            *ppVar14 = pVar5;
            break;
          case 3:
            pVar5 = *(png_byte *)(lVar9 + local_470);
            local_438[uVar24] = pVar5;
            if (pVar5 != 0xff) {
              num_trans = iVar8 + 1;
            }
          case 2:
            *ppVar14 = *(png_byte *)(lVar9 + uVar19);
            ppVar14[-1] = *(png_byte *)(lVar9 + lVar26);
            ((png_color *)(ppVar14 + -2))->red = *(png_byte *)(lVar9 + uVar11);
          }
        }
        else if ((uVar15 & 1) == 0) {
          if (uVar16 < 2) {
            uVar7 = (uint)*(ushort *)(lVar9 + -2 + lVar23) * 0xff;
            uVar20 = uVar7 >> 0xf;
            pVar5 = (png_byte)
                    (((uint)png_sRGB_delta[uVar20] * (uVar7 & 0x7fff) >> 0xc) +
                     (uint)png_sRGB_base[uVar20] >> 8);
            ppVar14[-1] = pVar5;
            ((png_color *)(ppVar14 + -2))->red = pVar5;
            *ppVar14 = pVar5;
          }
          else {
            uVar7 = (uint)*(ushort *)(lVar9 + uVar21) * 0xff;
            uVar20 = uVar7 >> 0xf;
            *ppVar14 = (png_byte)
                       (((uint)png_sRGB_delta[uVar20] * (uVar7 & 0x7fff) >> 0xc) +
                        (uint)png_sRGB_base[uVar20] >> 8);
            uVar7 = (uint)*(ushort *)(lVar9 + lVar23) * 0xff;
            uVar20 = uVar7 >> 0xf;
            ppVar14[-1] = (png_byte)
                          (((uint)png_sRGB_delta[uVar20] * (uVar7 & 0x7fff) >> 0xc) +
                           (uint)png_sRGB_base[uVar20] >> 8);
            uVar7 = (uint)*(ushort *)(lVar9 + local_478) * 0xff;
            uVar20 = uVar7 >> 0xf;
            ((png_color *)(ppVar14 + -2))->red =
                 (png_byte)
                 (((uint)png_sRGB_delta[uVar20] * (uVar7 & 0x7fff) >> 0xc) +
                  (uint)png_sRGB_base[uVar20] >> 8);
          }
        }
        else {
          uVar2 = *(ushort *)(lVar9 + uVar17);
          uVar7 = (uint)uVar2;
          uVar20 = (uVar7 * 0x100 - (uint)uVar2) + 0x807f;
          pVar13 = 0;
          uVar6 = uVar20 >> 0x10;
          if ((uVar6 != 0) && (uVar6 != 0xff)) {
            pVar13 = ((uVar2 >> 1) + 0x7f7f8080) / uVar7;
          }
          if (uVar6 != 0xff) {
            num_trans = iVar8 + 1;
          }
          local_438[uVar24] = (png_byte)(uVar20 >> 0x10);
          if (uVar16 < 2) {
            pVar5 = png_unpremultiply((uint)*(ushort *)(lVar9 + local_490),uVar7,pVar13);
            ppVar14[-1] = pVar5;
            ((png_color *)(ppVar14 + -2))->red = pVar5;
            *ppVar14 = pVar5;
          }
          else {
            pVar5 = png_unpremultiply((uint)*(ushort *)(lVar9 + local_488),uVar7,pVar13);
            *ppVar14 = pVar5;
            pVar5 = png_unpremultiply((uint)*(ushort *)(lVar9 + uVar25),uVar7,pVar13);
            ppVar14[-1] = pVar5;
            pVar5 = png_unpremultiply((uint)*(ushort *)(lVar9 + local_480),uVar7,pVar13);
            ((png_color *)(ppVar14 + -2))->red = pVar5;
          }
        }
        uVar24 = uVar24 + 1;
        ppVar14 = ppVar14 + 3;
        local_470 = local_470 + lVar12;
        uVar11 = uVar11 + lVar12;
        lVar26 = lVar26 + lVar12;
        uVar19 = uVar19 + lVar12;
        uVar18 = uVar18 + lVar12;
        uVar22 = uVar22 + lVar12;
        local_478 = local_478 + lVar1;
        lVar23 = lVar23 + lVar1;
        uVar21 = uVar21 + lVar1;
        local_480 = local_480 + lVar1;
        uVar25 = uVar25 + lVar1;
        local_488 = local_488 + lVar1;
        local_490 = local_490 + lVar1;
        uVar17 = uVar17 + lVar1;
      } while (uVar10 != uVar24);
    }
    png_set_PLTE(*(png_structrp *)*plVar4,(png_inforp)((undefined8 *)*plVar4)[1],palette,uVar10);
    if (0 < num_trans) {
      png_set_tRNS(*(png_structrp *)*plVar4,(png_inforp)((undefined8 *)*plVar4)[1],local_438,
                   num_trans,(png_const_color_16p)0x0);
    }
    *(uint *)((long)plVar4 + 0x1c) = uVar10;
  }
  if (bVar27 == false) {
    if ((image_in->flags & 1) == 0) {
      png_set_sRGB(png_ptr,info_ptr,0);
    }
    else {
      png_set_gAMA_fixed(png_ptr,info_ptr,0xb18f);
    }
    png_write_info(png_ptr,info_ptr);
  }
  else {
    png_set_gAMA_fixed(png_ptr,info_ptr,100000);
    if ((image_in->flags & 1) == 0) {
      png_set_cHRM_fixed(png_ptr,info_ptr,0x7a26,0x8084,64000,33000,30000,60000,15000,6000);
    }
    png_write_info(png_ptr,info_ptr);
    png_set_swap(png_ptr);
  }
  uVar15 = uVar3;
  if ((uVar3 & 0x10) != 0) {
    if ((uVar3 & 10) == 2) {
      png_set_bgr(png_ptr);
    }
    uVar15 = uVar3 & 0xffffffef;
  }
  if ((uVar15 & 0x20) != 0) {
    if ((uVar15 & 1) != 0 && (char)((uVar3 & 8) >> 3) == '\0') {
      png_set_swap_alpha(png_ptr);
    }
    uVar15 = uVar15 & 0xffffffdf;
  }
  if (((uVar3 & 8) != 0) && (image_in->colormap_entries < 0x11)) {
    png_set_packing(png_ptr);
  }
  if (uVar15 < 0x10) {
    lVar9 = *(long *)((long)argument + 8);
    lVar12 = (long)*(int *)((long)argument + 0x10) << ((uVar3 & 0xc) == 4);
    if ((long)*(int *)((long)argument + 0x10) < 0) {
      lVar9 = lVar9 - (ulong)(image_in->height - 1) * lVar12;
    }
    *(long *)((long)argument + 0x28) = lVar9;
    *(long *)((long)argument + 0x30) = lVar12;
    if (((image_in->flags & 2) != 0) && (png_set_filter(png_ptr,0,0), png_ptr != (png_structrp)0x0))
    {
      png_ptr->zlib_level = 3;
    }
    if (((uVar3 & 0xd) == 5) || (((uVar3 & 8) == 0 && (*(int *)((long)argument + 0x20) != 0)))) {
      size = png_get_rowbytes(png_ptr,info_ptr);
      ptr = png_malloc(png_ptr,size);
      *(png_voidp *)((long)argument + 0x38) = ptr;
      function = png_write_image_8bit;
      if (bVar27 != false) {
        function = png_write_image_16bit;
      }
      iVar8 = png_safe_execute(image_in,function,argument);
      *(undefined8 *)((long)argument + 0x38) = 0;
      png_free(png_ptr,ptr);
      if (iVar8 == 0) {
        return 0;
      }
    }
    else {
      pVar13 = image_in->height;
      if (pVar13 != 0) {
        lVar9 = *(long *)((long)argument + 0x30);
        row = *(png_const_bytep *)((long)argument + 0x28);
        do {
          png_write_row(png_ptr,row);
          row = row + lVar9;
          pVar13 = pVar13 - 1;
        } while (pVar13 != 0);
      }
    }
    png_write_end(png_ptr,info_ptr);
    return 1;
  }
  png_error(png_ptr,"png_write_image: unsupported transformation");
}

Assistant:

static int
png_image_write_main(png_voidp argument)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   png_inforp info_ptr = image->opaque->info_ptr;
   png_uint_32 format = image->format;

   /* The following four ints are actually booleans */
   int colormap = (format & PNG_FORMAT_FLAG_COLORMAP);
   int linear = !colormap && (format & PNG_FORMAT_FLAG_LINEAR); /* input */
   int alpha = !colormap && (format & PNG_FORMAT_FLAG_ALPHA);
   int write_16bit = linear && (display->convert_to_8bit == 0);

#   ifdef PNG_BENIGN_ERRORS_SUPPORTED
      /* Make sure we error out on any bad situation */
      png_set_benign_errors(png_ptr, 0/*error*/);
#   endif

   /* Default the 'row_stride' parameter if required, also check the row stride
    * and total image size to ensure that they are within the system limits.
    */
   {
      unsigned int channels = PNG_IMAGE_PIXEL_CHANNELS(image->format);

      if (image->width <= 0x7fffffffU/channels) /* no overflow */
      {
         png_uint_32 check;
         png_uint_32 png_row_stride = image->width * channels;

         if (display->row_stride == 0)
            display->row_stride = (png_int_32)/*SAFE*/png_row_stride;

         if (display->row_stride < 0)
            check = (png_uint_32)(-display->row_stride);

         else
            check = (png_uint_32)display->row_stride;

         if (check >= png_row_stride)
         {
            /* Now check for overflow of the image buffer calculation; this
             * limits the whole image size to 32 bits for API compatibility with
             * the current, 32-bit, PNG_IMAGE_BUFFER_SIZE macro.
             */
            if (image->height > 0xffffffffU/png_row_stride)
               png_error(image->opaque->png_ptr, "memory image too large");
         }

         else
            png_error(image->opaque->png_ptr, "supplied row stride too small");
      }

      else
         png_error(image->opaque->png_ptr, "image row stride too large");
   }

   /* Set the required transforms then write the rows in the correct order. */
   if ((format & PNG_FORMAT_FLAG_COLORMAP) != 0)
   {
      if (display->colormap != NULL && image->colormap_entries > 0)
      {
         png_uint_32 entries = image->colormap_entries;

         png_set_IHDR(png_ptr, info_ptr, image->width, image->height,
             entries > 16 ? 8 : (entries > 4 ? 4 : (entries > 2 ? 2 : 1)),
             PNG_COLOR_TYPE_PALETTE, PNG_INTERLACE_NONE,
             PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

         png_image_set_PLTE(display);
      }

      else
         png_error(image->opaque->png_ptr,
             "no color-map for color-mapped image");
   }

   else
      png_set_IHDR(png_ptr, info_ptr, image->width, image->height,
          write_16bit ? 16 : 8,
          ((format & PNG_FORMAT_FLAG_COLOR) ? PNG_COLOR_MASK_COLOR : 0) +
          ((format & PNG_FORMAT_FLAG_ALPHA) ? PNG_COLOR_MASK_ALPHA : 0),
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

   /* Counter-intuitively the data transformations must be called *after*
    * png_write_info, not before as in the read code, but the 'set' functions
    * must still be called before.  Just set the color space information, never
    * write an interlaced image.
    */

   if (write_16bit != 0)
   {
      /* The gamma here is 1.0 (linear) and the cHRM chunk matches sRGB. */
      png_set_gAMA_fixed(png_ptr, info_ptr, PNG_GAMMA_LINEAR);

      if ((image->flags & PNG_IMAGE_FLAG_COLORSPACE_NOT_sRGB) == 0)
         png_set_cHRM_fixed(png_ptr, info_ptr,
             /* color      x       y */
             /* white */ 31270, 32900,
             /* red   */ 64000, 33000,
             /* green */ 30000, 60000,
             /* blue  */ 15000,  6000
         );
   }

   else if ((image->flags & PNG_IMAGE_FLAG_COLORSPACE_NOT_sRGB) == 0)
      png_set_sRGB(png_ptr, info_ptr, PNG_sRGB_INTENT_PERCEPTUAL);

   /* Else writing an 8-bit file and the *colors* aren't sRGB, but the 8-bit
    * space must still be gamma encoded.
    */
   else
      png_set_gAMA_fixed(png_ptr, info_ptr, PNG_GAMMA_sRGB_INVERSE);

   /* Write the file header. */
   png_write_info(png_ptr, info_ptr);

   /* Now set up the data transformations (*after* the header is written),
    * remove the handled transformations from the 'format' flags for checking.
    *
    * First check for a little endian system if writing 16-bit files.
    */
   if (write_16bit != 0)
   {
      png_uint_16 le = 0x0001;

      if ((*(png_const_bytep) & le) != 0)
         png_set_swap(png_ptr);
   }

#   ifdef PNG_SIMPLIFIED_WRITE_BGR_SUPPORTED
      if ((format & PNG_FORMAT_FLAG_BGR) != 0)
      {
         if (colormap == 0 && (format & PNG_FORMAT_FLAG_COLOR) != 0)
            png_set_bgr(png_ptr);
         format &= ~PNG_FORMAT_FLAG_BGR;
      }
#   endif

#   ifdef PNG_SIMPLIFIED_WRITE_AFIRST_SUPPORTED
      if ((format & PNG_FORMAT_FLAG_AFIRST) != 0)
      {
         if (colormap == 0 && (format & PNG_FORMAT_FLAG_ALPHA) != 0)
            png_set_swap_alpha(png_ptr);
         format &= ~PNG_FORMAT_FLAG_AFIRST;
      }
#   endif

   /* If there are 16 or fewer color-map entries we wrote a lower bit depth
    * above, but the application data is still byte packed.
    */
   if (colormap != 0 && image->colormap_entries <= 16)
      png_set_packing(png_ptr);

   /* That should have handled all (both) the transforms. */
   if ((format & ~(png_uint_32)(PNG_FORMAT_FLAG_COLOR | PNG_FORMAT_FLAG_LINEAR |
         PNG_FORMAT_FLAG_ALPHA | PNG_FORMAT_FLAG_COLORMAP)) != 0)
      png_error(png_ptr, "png_write_image: unsupported transformation");

   {
      png_const_bytep row = png_voidcast(png_const_bytep, display->buffer);
      ptrdiff_t row_bytes = display->row_stride;

      if (linear != 0)
         row_bytes *= (sizeof (png_uint_16));

      if (row_bytes < 0)
         row += (image->height-1) * (-row_bytes);

      display->first_row = row;
      display->row_bytes = row_bytes;
   }

   /* Apply 'fast' options if the flag is set. */
   if ((image->flags & PNG_IMAGE_FLAG_FAST) != 0)
   {
      png_set_filter(png_ptr, PNG_FILTER_TYPE_BASE, PNG_NO_FILTERS);
      /* NOTE: determined by experiment using pngstest, this reflects some
       * balance between the time to write the image once and the time to read
       * it about 50 times.  The speed-up in pngstest was about 10-20% of the
       * total (user) time on a heavily loaded system.
       */
#   ifdef PNG_WRITE_CUSTOMIZE_COMPRESSION_SUPPORTED
      png_set_compression_level(png_ptr, 3);
#   endif
   }

   /* Check for the cases that currently require a pre-transform on the row
    * before it is written.  This only applies when the input is 16-bit and
    * either there is an alpha channel or it is converted to 8-bit.
    */
   if ((linear != 0 && alpha != 0 ) ||
       (colormap == 0 && display->convert_to_8bit != 0))
   {
      png_bytep row = png_voidcast(png_bytep, png_malloc(png_ptr,
          png_get_rowbytes(png_ptr, info_ptr)));
      int result;

      display->local_row = row;
      if (write_16bit != 0)
         result = png_safe_execute(image, png_write_image_16bit, display);
      else
         result = png_safe_execute(image, png_write_image_8bit, display);
      display->local_row = NULL;

      png_free(png_ptr, row);

      /* Skip the 'write_end' on error: */
      if (result == 0)
         return 0;
   }

   /* Otherwise this is the case where the input is in a format currently
    * supported by the rest of the libpng write code; call it directly.
    */
   else
   {
      png_const_bytep row = png_voidcast(png_const_bytep, display->first_row);
      ptrdiff_t row_bytes = display->row_bytes;
      png_uint_32 y = image->height;

      for (; y > 0; --y)
      {
         png_write_row(png_ptr, row);
         row += row_bytes;
      }
   }

   png_write_end(png_ptr, info_ptr);
   return 1;
}